

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

QRect __thiscall QTabBarPrivate::normalizedScrollRect(QTabBarPrivate *this,int index)

{
  bool bVar1;
  LayoutDirection LVar2;
  int iVar3;
  int iVar4;
  QTabBar *pQVar5;
  QStyle *pQVar6;
  long lVar7;
  qsizetype qVar8;
  int in_ESI;
  QTabBarPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  QRect QVar10;
  bool tearRightVisible;
  bool tearLeftVisible;
  bool rightButtonIsOnLeftSide;
  bool leftButtonIsOnLeftSide;
  int rightEdge;
  int leftEdge;
  bool tearBottomVisible;
  bool tearTopVisible;
  bool rightButtonIsOnTop;
  bool leftButtonIsOnTop;
  int bottomEdge;
  int topEdge;
  QTabBar *q;
  QRect tearRightRect;
  QRect tearLeftRect;
  QRect scrollButtonRightRect;
  QRect scrollButtonLeftRect;
  QStyleOptionTab opt;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  QRect *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  QRect *in_stack_fffffffffffffdf0;
  LayoutDirection in_stack_fffffffffffffdfc;
  int local_1c8;
  int local_1c4;
  int local_1b8;
  int local_1b4;
  undefined8 local_d8;
  undefined8 local_d0;
  QRect local_b8;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 local_90;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  bVar1 = QWidget::isHidden((QWidget *)0x6aabd9);
  if (bVar1) {
    bVar1 = verticalTabs(in_RDI->shape);
    if (bVar1) {
      QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      local_b8 = QRect::transposed((QRect *)CONCAT44(in_stack_fffffffffffffde4,
                                                     in_stack_fffffffffffffde0));
    }
    else {
      local_b8 = QWidget::rect((QWidget *)
                               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    }
  }
  else {
    memset(local_a8,0xaa,0xa0);
    QStyleOptionTab::QStyleOptionTab((QStyleOptionTab *)0x6aac77);
    (**(code **)(*(long *)&pQVar5->super_QWidget + 0x1c8))(pQVar5,local_a8,in_RDI->currentIndex);
    QVar10 = QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
    ;
    local_d8 = QVar10._0_8_;
    local_98 = local_d8;
    local_d0 = QVar10._8_8_;
    local_90 = local_d0;
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                           );
    (**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x35,local_a8,pQVar5);
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                           );
    (**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x36,local_a8,pQVar5);
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                           );
    (**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x18,local_a8,pQVar5);
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                           );
    (**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x37,local_a8,pQVar5);
    bVar1 = verticalTabs(in_RDI->shape);
    if (bVar1) {
      iVar3 = QRect::y((QRect *)0x6aae87);
      iVar4 = QWidget::height((QWidget *)0x6aae98);
      bVar1 = iVar3 < iVar4 / 2;
      iVar3 = QRect::y((QRect *)0x6aaebe);
      iVar4 = QWidget::height((QWidget *)0x6aaecf);
      bVar9 = iVar3 < iVar4 / 2;
      if ((bVar1) && (bVar9)) {
        local_1b4 = QRect::bottom((QRect *)0x6aaf03);
        local_1b4 = local_1b4 + 1;
        local_1b8 = QWidget::height((QWidget *)0x6aaf1a);
      }
      else if ((bVar1) || (bVar9)) {
        local_1b4 = QRect::bottom((QRect *)0x6aaf5f);
        local_1b4 = local_1b4 + 1;
        local_1b8 = QRect::top((QRect *)0x6aaf76);
      }
      else {
        local_1b4 = 0;
        local_1b8 = QRect::top((QRect *)0x6aaf49);
      }
      bVar1 = false;
      if (in_ESI != 0) {
        bVar1 = local_1b4 != -in_RDI->scrollOffset;
      }
      qVar8 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList);
      bVar9 = false;
      if ((long)in_ESI != qVar8 + -1) {
        QList<QTabBarPrivate::Tab_*>::constLast
                  ((QList<QTabBarPrivate::Tab_*> *)
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        iVar3 = QRect::bottom((QRect *)0x6ab013);
        bVar9 = local_1b8 != (iVar3 + 1) - in_RDI->scrollOffset;
      }
      if ((bVar1) &&
         (bVar1 = QRect::isNull((QRect *)CONCAT44(in_stack_fffffffffffffdd4,
                                                  in_stack_fffffffffffffdd0)), !bVar1)) {
        QRect::bottom((QRect *)0x6ab05f);
      }
      if ((bVar9) &&
         (bVar1 = QRect::isNull((QRect *)CONCAT44(in_stack_fffffffffffffdd4,
                                                  in_stack_fffffffffffffdd0)), !bVar1)) {
        QRect::top((QRect *)0x6ab08e);
      }
      QWidget::height((QWidget *)0x6ab0bf);
      QRect::QRect(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8);
    }
    else {
      LVar2 = QWidget::layoutDirection((QWidget *)0x6ab0f3);
      if (LVar2 == RightToLeft) {
        QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QStyle::visualRect(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0,
                           (QRect *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QStyle::visualRect(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0,
                           (QRect *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QStyle::visualRect(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0,
                           (QRect *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QWidget::rect((QWidget *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        QStyle::visualRect(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0,
                           (QRect *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      }
      iVar3 = QRect::x((QRect *)0x6ab2b5);
      iVar4 = QWidget::width((QWidget *)0x6ab2c6);
      bVar1 = iVar3 < iVar4 / 2;
      iVar3 = QRect::x((QRect *)0x6ab2ec);
      iVar4 = QWidget::width((QWidget *)0x6ab2fd);
      bVar9 = iVar3 < iVar4 / 2;
      if ((bVar1) && (bVar9)) {
        local_1c4 = QRect::right((QRect *)0x6ab331);
        local_1c4 = local_1c4 + 1;
        local_1c8 = QWidget::width((QWidget *)0x6ab345);
      }
      else if ((bVar1) || (bVar9)) {
        local_1c4 = QRect::right((QRect *)0x6ab381);
        local_1c4 = local_1c4 + 1;
        local_1c8 = QRect::left((QRect *)0x6ab395);
      }
      else {
        local_1c4 = 0;
        local_1c8 = QRect::left((QRect *)0x6ab36e);
      }
      bVar1 = false;
      if (in_ESI != 0) {
        bVar1 = local_1c4 != -in_RDI->scrollOffset;
      }
      lVar7 = (long)in_ESI;
      qVar8 = QList<QTabBarPrivate::Tab_*>::size(&in_RDI->tabList);
      bVar9 = false;
      if (lVar7 != qVar8 + -1) {
        QList<QTabBarPrivate::Tab_*>::constLast
                  ((QList<QTabBarPrivate::Tab_*> *)
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        iVar3 = QRect::right((QRect *)0x6ab429);
        bVar9 = local_1c8 != (iVar3 + 1) - in_RDI->scrollOffset;
      }
      if ((bVar1) &&
         (bVar1 = QRect::isNull((QRect *)CONCAT44(in_stack_fffffffffffffdd4,
                                                  in_stack_fffffffffffffdd0)), !bVar1)) {
        QRect::right((QRect *)0x6ab475);
      }
      if ((bVar9) &&
         (bVar1 = QRect::isNull((QRect *)CONCAT44(in_stack_fffffffffffffdd4,
                                                  in_stack_fffffffffffffdd0)), !bVar1)) {
        QRect::left((QRect *)0x6ab4a1);
      }
      QWidget::height((QWidget *)0x6ab4c6);
      QRect::QRect(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8);
    }
    QStyleOptionTab::~QStyleOptionTab
              ((QStyleOptionTab *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_b8;
}

Assistant:

QRect QTabBarPrivate::normalizedScrollRect(int index)
{
    // "Normalized scroll rect" means return the free space on the tab bar
    // that doesn't overlap with scroll buttons or tear indicators, and
    // always return the rect as horizontal Qt::LeftToRight, even if the
    // tab bar itself is in a different orientation.

    Q_Q(QTabBar);
    // If scrollbuttons are not visible, then there's no tear either, and
    // the entire widget is the scroll rect.
    if (leftB->isHidden())
        return verticalTabs(shape) ? q->rect().transposed() : q->rect();

    QStyleOptionTab opt;
    q->initStyleOption(&opt, currentIndex);
    opt.rect = q->rect();

    QRect scrollButtonLeftRect = q->style()->subElementRect(QStyle::SE_TabBarScrollLeftButton, &opt, q);
    QRect scrollButtonRightRect = q->style()->subElementRect(QStyle::SE_TabBarScrollRightButton, &opt, q);
    QRect tearLeftRect = q->style()->subElementRect(QStyle::SE_TabBarTearIndicatorLeft, &opt, q);
    QRect tearRightRect = q->style()->subElementRect(QStyle::SE_TabBarTearIndicatorRight, &opt, q);

    if (verticalTabs(shape)) {
        int topEdge, bottomEdge;
        bool leftButtonIsOnTop = scrollButtonLeftRect.y() < q->height() / 2;
        bool rightButtonIsOnTop = scrollButtonRightRect.y() < q->height() / 2;

        if (leftButtonIsOnTop && rightButtonIsOnTop) {
            topEdge = scrollButtonRightRect.bottom() + 1;
            bottomEdge = q->height();
        } else if (!leftButtonIsOnTop && !rightButtonIsOnTop) {
            topEdge = 0;
            bottomEdge = scrollButtonLeftRect.top();
        } else {
            topEdge = scrollButtonLeftRect.bottom() + 1;
            bottomEdge = scrollButtonRightRect.top();
        }

        bool tearTopVisible = index != 0 && topEdge != -scrollOffset;
        bool tearBottomVisible = index != tabList.size() - 1 && bottomEdge != tabList.constLast()->rect.bottom() + 1 - scrollOffset;
        if (tearTopVisible && !tearLeftRect.isNull())
            topEdge = tearLeftRect.bottom() + 1;
        if (tearBottomVisible && !tearRightRect.isNull())
            bottomEdge = tearRightRect.top();

        return QRect(topEdge, 0, bottomEdge - topEdge, q->height());
    } else {
        if (q->layoutDirection() == Qt::RightToLeft) {
            scrollButtonLeftRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), scrollButtonLeftRect);
            scrollButtonRightRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), scrollButtonRightRect);
            tearLeftRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), tearLeftRect);
            tearRightRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), tearRightRect);
        }

        int leftEdge, rightEdge;
        bool leftButtonIsOnLeftSide = scrollButtonLeftRect.x() < q->width() / 2;
        bool rightButtonIsOnLeftSide = scrollButtonRightRect.x() < q->width() / 2;

        if (leftButtonIsOnLeftSide && rightButtonIsOnLeftSide) {
            leftEdge = scrollButtonRightRect.right() + 1;
            rightEdge = q->width();
        } else if (!leftButtonIsOnLeftSide && !rightButtonIsOnLeftSide) {
            leftEdge = 0;
            rightEdge = scrollButtonLeftRect.left();
        } else {
            leftEdge = scrollButtonLeftRect.right() + 1;
            rightEdge = scrollButtonRightRect.left();
        }

        bool tearLeftVisible = index != 0 && leftEdge != -scrollOffset;
        bool tearRightVisible = index != tabList.size() - 1 && rightEdge != tabList.constLast()->rect.right() + 1 - scrollOffset;
        if (tearLeftVisible && !tearLeftRect.isNull())
            leftEdge = tearLeftRect.right() + 1;
        if (tearRightVisible && !tearRightRect.isNull())
            rightEdge = tearRightRect.left();

        return QRect(leftEdge, 0, rightEdge - leftEdge, q->height());
    }
}